

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void print_range_internal(char *pre,int ndim,int *lo,int *hi,char *post)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  int i;
  int local_2c;
  
  printf("%s[",in_RDI);
  for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
    printf("%d:%d",(ulong)*(uint *)(in_RDX + (long)local_2c * 4),
           (ulong)*(uint *)(in_RCX + (long)local_2c * 4));
    if (local_2c == in_ESI + -1) {
      printf("] %s",in_R8);
    }
    else {
      printf(",");
    }
  }
  return;
}

Assistant:

void print_range_internal(char *pre,int ndim, int lo[], int hi[], char* post)
{
    int i;

    printf("%s[",pre);
    for(i=0;i<ndim;i++){
        printf("%d:%d",lo[i],hi[i]);
        if(i==ndim-1)printf("] %s",post);
        else printf(",");
    }
}